

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.hpp
# Opt level: O0

result_type __thiscall
pstore::serialize::archive::writer_base<pstore::serialize::archive::details::database_writer_policy>
::putn<pstore::gsl::span<unsigned_char,_1l>>
          (writer_base<pstore::serialize::archive::details::database_writer_policy> *this,
          span<unsigned_char,__1L> sp)

{
  type tVar1;
  pointer in_RCX;
  span<unsigned_char,__1L> span;
  index_type local_40;
  database_writer_policy *local_38;
  pointer local_30;
  writer_base<pstore::serialize::archive::details::database_writer_policy> *local_28;
  writer_base<pstore::serialize::archive::details::database_writer_policy> *this_local;
  span<unsigned_char,__1L> sp_local;
  result_type r;
  
  span.storage_.super_extent_type<_1L>.size_ = (index_type)sp.storage_.data_;
  local_38 = (database_writer_policy *)sp.storage_.super_extent_type<_1L>.size_;
  local_28 = this;
  this_local = (writer_base<pstore::serialize::archive::details::database_writer_policy> *)local_38;
  sp_local.storage_.super_extent_type<_1L>.size_ = span.storage_.super_extent_type<_1L>.size_;
  if ((this->flushed_ & 1U) == 0) {
    span.storage_.data_ = in_RCX;
    local_30 = (pointer)span.storage_.super_extent_type<_1L>.size_;
    sp_local.storage_.data_ =
         (pointer)putn_helper::putn<pstore::gsl::span<unsigned_char,_1l>>
                            ((putn_helper *)&this->policy_,local_38,span);
    local_40 = gsl::span<unsigned_char,_-1L>::size_bytes((span<unsigned_char,__1L> *)&this_local);
    tVar1 = unsigned_cast<long>(&local_40);
    this->bytes_consumed_ = tVar1 + this->bytes_consumed_;
    return (result_type)(value_type)sp_local.storage_.data_;
  }
  assert_failed("!flushed_",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/serialize/archive.hpp"
                ,0xb5);
}

Assistant:

auto putn (Span sp) -> result_type {
                    using element_type = typename Span::element_type;
                    static_assert (std::is_standard_layout<element_type>::value,
                                   "writer_base can only write standard-layout types!");
                    PSTORE_ASSERT (!flushed_);
                    auto r = putn_helper::template putn<Span> (policy_, sp);
                    bytes_consumed_ += unsigned_cast (sp.size_bytes ());
                    return r;
                }